

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O3

void andres::marray_detail::
     operate<andres::marray_detail::PlusEqual<short,short>,short,std::allocator<unsigned_long>>
               (View<short,_false,_std::allocator<unsigned_long>_> *v,short *x)

{
  bool bVar1;
  reference psVar2;
  short *psVar3;
  size_t sVar4;
  reference psVar5;
  runtime_error *this;
  size_t sVar6;
  ulong uVar7;
  iterator it;
  Iterator<short,_false,_std::allocator<unsigned_long>_> local_50;
  
  View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
  if ((v->geometry_).isSimple_ == true) {
    local_50.view_._0_4_ = 0;
    psVar2 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_50);
    sVar4 = (v->geometry_).size_;
    if (sVar4 == 0) {
      return;
    }
    sVar6 = 0;
    do {
      psVar2[sVar6] = psVar2[sVar6] + *x;
      sVar6 = sVar6 + 1;
    } while (sVar4 != sVar6);
    return;
  }
  if (v->data_ == (pointer)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Assertion failed.");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  switch((v->geometry_).dimension_) {
  case 1:
    local_50.view_._0_4_ = 0;
    psVar3 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_50);
    sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,0);
    if (sVar4 != 0) {
      uVar7 = 0;
      do {
        *psVar3 = *psVar3 + *x;
        sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::strides(v,0);
        psVar3 = psVar3 + sVar4;
        uVar7 = uVar7 + 1;
        sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,0);
      } while (uVar7 < sVar4);
    }
    View<short,_false,_std::allocator<unsigned_long>_>::shape(v,0);
    sVar4 = 0;
    goto LAB_00223674;
  case 2:
    local_50.view_._0_4_ = 0;
    psVar2 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_50);
    OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
    ::operate(v,x,psVar2);
    break;
  case 3:
    local_50.view_._0_4_ = 0;
    psVar2 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_50);
    sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,2);
    if (sVar4 != 0) {
      uVar7 = 0;
      do {
        OperateHelperBinaryScalar<(unsigned_short)2,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
        ::operate(v,x,psVar2);
        sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::strides(v,2);
        psVar2 = psVar2 + sVar4;
        uVar7 = uVar7 + 1;
        sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::shape(v,2);
      } while (uVar7 < sVar4);
    }
    View<short,_false,_std::allocator<unsigned_long>_>::shape(v,2);
    sVar4 = 2;
LAB_00223674:
    View<short,_false,_std::allocator<unsigned_long>_>::strides(v,sVar4);
    break;
  case 4:
    local_50.view_._0_4_ = 0;
    psVar2 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_50);
    OperateHelperBinaryScalar<(unsigned_short)4,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
    ::operate(v,x,psVar2);
    break;
  case 5:
    local_50.view_._0_4_ = 0;
    psVar2 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                       (v,(int *)&local_50);
    OperateHelperBinaryScalar<(unsigned_short)5,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
    ::operate(v,x,psVar2);
    break;
  default:
    sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
    if (sVar4 == 6) {
      local_50.view_._0_4_ = 0;
      psVar2 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                         (v,(int *)&local_50);
      OperateHelperBinaryScalar<(unsigned_short)6,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
      ::operate(v,x,psVar2);
    }
    else {
      sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
      if (sVar4 == 7) {
        local_50.view_._0_4_ = 0;
        psVar2 = AccessOperatorHelper<true>::execute<short,int,false,std::allocator<unsigned_long>>
                           (v,(int *)&local_50);
        OperateHelperBinaryScalar<(unsigned_short)7,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
        ::operate(v,x,psVar2);
      }
      else {
        sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
        if (sVar4 == 8) {
          local_50.view_._0_4_ = 0;
          psVar2 = AccessOperatorHelper<true>::
                   execute<short,int,false,std::allocator<unsigned_long>>(v,(int *)&local_50);
          OperateHelperBinaryScalar<(unsigned_short)8,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
          ::operate(v,x,psVar2);
        }
        else {
          sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
          if (sVar4 == 9) {
            local_50.view_._0_4_ = 0;
            psVar2 = AccessOperatorHelper<true>::
                     execute<short,int,false,std::allocator<unsigned_long>>(v,(int *)&local_50);
            OperateHelperBinaryScalar<(unsigned_short)9,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
            ::operate(v,x,psVar2);
          }
          else {
            sVar4 = View<short,_false,_std::allocator<unsigned_long>_>::dimension(v);
            if (sVar4 == 10) {
              local_50.view_._0_4_ = 0;
              psVar2 = AccessOperatorHelper<true>::
                       execute<short,int,false,std::allocator<unsigned_long>>(v,(int *)&local_50);
              OperateHelperBinaryScalar<(unsigned_short)10,_andres::marray_detail::PlusEqual<short,_short>,_short,_short,_std::allocator<unsigned_long>_>
              ::operate(v,x,psVar2);
            }
            else {
              View<short,_false,_std::allocator<unsigned_long>_>::testInvariant(v);
              Iterator<short,_false,_std::allocator<unsigned_long>_>::Iterator(&local_50,v,0);
              while (bVar1 = Iterator<short,_false,_std::allocator<unsigned_long>_>::hasMore
                                       (&local_50), bVar1) {
                psVar5 = Iterator<short,_false,_std::allocator<unsigned_long>_>::operator*
                                   (&local_50);
                *psVar5 = *psVar5 + *x;
                Iterator<short,_false,_std::allocator<unsigned_long>_>::operator++(&local_50);
              }
              if (local_50.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_50.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_50.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_50.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

inline void 
operate
(
    View<T, false, A>& v, 
    const T& x, 
    Functor f
)
{
    if(v.isSimple()) {
        T* data = &v(0);
        for(std::size_t j=0; j<v.size(); ++j) {
            f(data[j], x);
        }
    }
    else if(v.dimension() == 1)
        OperateHelperBinaryScalar<1, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 2)
        OperateHelperBinaryScalar<2, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 3)
        OperateHelperBinaryScalar<3, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 4)
        OperateHelperBinaryScalar<4, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 5)
        OperateHelperBinaryScalar<5, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 6)
        OperateHelperBinaryScalar<6, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 7)
        OperateHelperBinaryScalar<7, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 8)
        OperateHelperBinaryScalar<8, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 9)
        OperateHelperBinaryScalar<9, Functor, T, T, A>::operate(v, x, f, &v(0));
    else if(v.dimension() == 10)
        OperateHelperBinaryScalar<10, Functor, T, T, A>::operate(v, x, f, &v(0));
    else {
        for(typename View<T, false, A>::iterator it = v.begin(); it.hasMore(); ++it) {
            f(*it, x); 
        }
    }
}